

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run-parser-test-suite.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  yaml_event_t event;
  yaml_parser_t parser;
  yaml_event_t local_278;
  yaml_parser_t local_210;
  
  if (argc == 2) {
    __stream = fopen(argv[1],"rb");
  }
  else {
    __stream = _stdin;
    if (argc != 1) {
      main_cold_3();
      return 1;
    }
  }
  if (__stream == (FILE *)0x0) {
    __assert_fail("input",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/tests/run-parser-test-suite.c"
                  ,0x16,"int main(int, char **)");
  }
  iVar1 = yaml_parser_initialize(&local_210);
  if (iVar1 == 0) {
    main_cold_2();
  }
  else {
    yaml_parser_set_input_file(&local_210,(FILE *)__stream);
    iVar1 = yaml_parser_parse(&local_210,&local_278);
    if (iVar1 != 0) {
      do {
        switch(local_278.type) {
        case YAML_NO_EVENT:
          pcVar2 = "???";
          break;
        case YAML_STREAM_START_EVENT:
          pcVar2 = "+STR";
          break;
        case YAML_STREAM_END_EVENT:
          puts("-STR");
          yaml_event_delete(&local_278);
          iVar1 = fclose(__stream);
          if (iVar1 != 0) {
            __assert_fail("!fclose(input)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/tests/run-parser-test-suite.c"
                          ,0x73,"int main(int, char **)");
          }
          yaml_parser_delete(&local_210);
          fflush(_stdout);
          return 0;
        case YAML_DOCUMENT_START_EVENT:
          printf("+DOC");
          if (local_278.data.document_start.implicit == 0) {
            pcVar2 = " ---";
LAB_00102400:
            printf(pcVar2);
          }
          goto LAB_00102509;
        case YAML_DOCUMENT_END_EVENT:
          printf("-DOC");
          if (local_278.data.stream_start.encoding == YAML_ANY_ENCODING) {
            pcVar2 = " ...";
            goto LAB_00102400;
          }
          goto LAB_00102509;
        case YAML_ALIAS_EVENT:
          printf("=ALI *%s\n",CONCAT44(local_278.data._4_4_,local_278.data.stream_start.encoding));
          goto LAB_00102513;
        case YAML_SCALAR_EVENT:
          printf("=VAL");
          if (CONCAT44(local_278.data._4_4_,local_278.data.stream_start.encoding) != 0) {
            printf(" &%s");
          }
          if (local_278.data.document_start.tag_directives.start != (yaml_tag_directive_t *)0x0) {
            printf(" <%s>");
          }
          pcVar2 = " :";
          switch(local_278.data.scalar.style) {
          case YAML_ANY_SCALAR_STYLE:
            goto switchD_001023aa_default;
          case YAML_PLAIN_SCALAR_STYLE:
            break;
          case YAML_SINGLE_QUOTED_SCALAR_STYLE:
            pcVar2 = " \'";
            break;
          case YAML_DOUBLE_QUOTED_SCALAR_STYLE:
            pcVar2 = " \"";
            break;
          case YAML_LITERAL_SCALAR_STYLE:
            pcVar2 = " |";
            break;
          case YAML_FOLDED_SCALAR_STYLE:
            pcVar2 = " >";
            break;
          default:
            goto switchD_00102479_default;
          }
          printf(pcVar2);
switchD_00102479_default:
          print_escaped(local_278.data.scalar.value,
                        CONCAT44(local_278.data.scalar.length._4_4_,
                                 local_278.data.document_start.implicit));
          goto LAB_00102509;
        case YAML_SEQUENCE_START_EVENT:
          pcVar2 = "+SEQ";
          goto LAB_00102494;
        case YAML_SEQUENCE_END_EVENT:
          pcVar2 = "-SEQ";
          break;
        case YAML_MAPPING_START_EVENT:
          pcVar2 = "+MAP";
LAB_00102494:
          printf(pcVar2);
          if (CONCAT44(local_278.data._4_4_,local_278.data.stream_start.encoding) != 0) {
            printf(" &%s");
          }
          if (local_278.data.document_start.tag_directives.start != (yaml_tag_directive_t *)0x0) {
            printf(" <%s>");
          }
LAB_00102509:
          putchar(10);
          goto LAB_00102513;
        case YAML_MAPPING_END_EVENT:
          pcVar2 = "-MAP";
          break;
        default:
switchD_001023aa_default:
          abort();
        }
        puts(pcVar2);
LAB_00102513:
        yaml_event_delete(&local_278);
        iVar1 = yaml_parser_parse(&local_210,&local_278);
      } while (iVar1 != 0);
    }
    main_cold_1();
  }
  return 1;
}

Assistant:

int main(int argc, char *argv[])
{
    FILE *input;
    yaml_parser_t parser;
    yaml_event_t event;

    if (argc == 1)
        input = stdin;
    else if (argc == 2)
        input = fopen(argv[1], "rb");
    else {
        fprintf(stderr, "Usage: libyaml-parser [<input-file>]\n");
        return 1;
    }
    assert(input);

    if (!yaml_parser_initialize(&parser)) {
        fprintf(stderr, "Could not initialize the parser object\n");
        return 1;
    }
    yaml_parser_set_input_file(&parser, input);

    while (1) {
        yaml_event_type_t type;
        if (!yaml_parser_parse(&parser, &event)) {
            fprintf(stderr, "Parse error: %s\n", parser.problem);
            return 1;
        }
        type = event.type;

        if (type == YAML_NO_EVENT)
            printf("???\n");
        else if (type == YAML_STREAM_START_EVENT)
            printf("+STR\n");
        else if (type == YAML_STREAM_END_EVENT)
            printf("-STR\n");
        else if (type == YAML_DOCUMENT_START_EVENT) {
            printf("+DOC");
            if (!event.data.document_start.implicit)
                printf(" ---");
            printf("\n");
        }
        else if (type == YAML_DOCUMENT_END_EVENT) {
            printf("-DOC");
            if (!event.data.document_end.implicit)
                printf(" ...");
            printf("\n");
        }
        else if (type == YAML_MAPPING_START_EVENT) {
            printf("+MAP");
            if (event.data.mapping_start.anchor)
                printf(" &%s", event.data.mapping_start.anchor);
            if (event.data.mapping_start.tag)
                printf(" <%s>", event.data.mapping_start.tag);
            printf("\n");
        }
        else if (type == YAML_MAPPING_END_EVENT)
            printf("-MAP\n");
        else if (type == YAML_SEQUENCE_START_EVENT) {
            printf("+SEQ");
            if (event.data.sequence_start.anchor)
                printf(" &%s", event.data.sequence_start.anchor);
            if (event.data.sequence_start.tag)
                printf(" <%s>", event.data.sequence_start.tag);
            printf("\n");
        }
        else if (type == YAML_SEQUENCE_END_EVENT)
            printf("-SEQ\n");
        else if (type == YAML_SCALAR_EVENT) {
            printf("=VAL");
            if (event.data.scalar.anchor)
                printf(" &%s", event.data.scalar.anchor);
            if (event.data.scalar.tag)
                printf(" <%s>", event.data.scalar.tag);
            switch (event.data.scalar.style) {
            case YAML_PLAIN_SCALAR_STYLE:
                printf(" :");
                break;
            case YAML_SINGLE_QUOTED_SCALAR_STYLE:
                printf(" '");
                break;
            case YAML_DOUBLE_QUOTED_SCALAR_STYLE:
                printf(" \"");
                break;
            case YAML_LITERAL_SCALAR_STYLE:
                printf(" |");
                break;
            case YAML_FOLDED_SCALAR_STYLE:
                printf(" >");
                break;
            case YAML_ANY_SCALAR_STYLE:
                abort();
            }
            print_escaped(event.data.scalar.value, event.data.scalar.length);
            printf("\n");
        }
        else if (type == YAML_ALIAS_EVENT)
            printf("=ALI *%s\n", event.data.alias.anchor);
        else
            abort();

        yaml_event_delete(&event);

        if (type == YAML_STREAM_END_EVENT)
            break;
    }

    assert(!fclose(input));
    yaml_parser_delete(&parser);
    fflush(stdout);

    return 0;
}